

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::AdvancedPipelineComputeChain::Run(AdvancedPipelineComputeChain *this)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  pointer *ppMVar1;
  uint uVar2;
  undefined1 uVar3;
  undefined1 auVar4 [16];
  pointer pMVar5;
  bool bVar6;
  GLuint program;
  pointer __dest;
  void *pvVar7;
  stringstream *psVar8;
  undefined8 *puVar9;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *pvVar10;
  undefined1 *puVar11;
  int row;
  long lVar12;
  float *pfVar13;
  int row_1;
  bool *compile_error;
  long lVar14;
  stringstream *psVar15;
  undefined8 uVar16;
  allocator_type *__a;
  ulong uVar17;
  int row_2;
  long lVar18;
  value_type_conflict5 *__val_1;
  long lVar19;
  value_type_conflict1 *__val;
  float *pfVar20;
  undefined1 auVar21 [16];
  undefined4 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  long *local_250;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> data_1;
  pointer local_200;
  Matrix<float,_4,_4> res_1;
  stringstream ss;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [376];
  
  ppMVar1 = &data_1.
             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  local_250 = &DAT_01a3a620;
  lVar19 = 0;
  do {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    local_200 = (pointer)0x239;
    data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppMVar1;
    __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&data_1,(ulong)&local_200);
    pMVar5 = local_200;
    data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_200;
    data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = __dest;
    memcpy(__dest,
           "\nstruct S0 {\n  int m0[8];\n};\nstruct S1 {\n  S0 m0[8];\n};\nlayout(binding = 0, std430) buffer Buffer0 {\n  int m0[5];\n  S1 m1[8];\n} g_buffer0;\nlayout(binding = 1, std430) buffer Buffer1 {\n  uint data[8];\n} g_buffer1;\nlayout(binding = 2, std430) buffer Buffer2 {\n  int data[256];\n} g_buffer2;\nlayout(binding = 3, std430) buffer Buffer3 {\n  int data[256];\n} g_buffer3;\nlayout(binding = 4, std430) buffer Buffer4 {\n  mat4 data0;\n  mat4 data1;\n} g_buffer4;\nlayout(binding = 0, rgba32f) uniform image2D g_image0;\nlayout(binding = 1, offset = 8) uniform atomic_uint g_counter[2];"
           ,0x239);
    data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pMVar5;
    *(undefined1 *)
     ((long)(pMVar5->m_data).m_data[0].m_data + (long)(__dest->m_data).m_data[0].m_data) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               (char *)data_1.
                       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(long)pMVar5);
    if (data_1.
        super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)ppMVar1) {
      operator_delete(data_1.
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)((data_1.
                                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data).
                                    m_data[0].m_data + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               (char *)((long)&DAT_01a3a610 + (long)*(int *)((long)&DAT_01a3a610 + lVar19)),
               *local_250);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    program = ComputeShaderBase::CreateComputeProgram
                        (&this->super_ComputeShaderBase,(string *)&res_1);
    *(GLuint *)((long)this->m_program + lVar19) = program;
    if ((Vector<float,_4> *)res_1.m_data.m_data[0].m_data._0_8_ != res_1.m_data.m_data + 1) {
      operator_delete((void *)res_1.m_data.m_data[0].m_data._0_8_,
                      res_1.m_data.m_data[1].m_data._0_8_ + 1);
      program = *(GLuint *)((long)this->m_program + lVar19);
    }
    glu::CallLogWrapper::glLinkProgram(this_00,program);
    bVar6 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,*(GLuint *)((long)this->m_program + lVar19),
                       compile_error);
    if (!bVar6) {
      return -1;
    }
    local_250 = local_250 + 1;
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0xc);
  glu::CallLogWrapper::glGenBuffers(this_00,4,this->m_storage_buffer);
  pvVar7 = operator_new(0x814);
  memset(pvVar7,0,0x814);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x814,pvVar7,0x88e6);
  operator_delete(pvVar7,0x814);
  local_1a8._0_8_ = (_func_int **)0x0;
  local_1a8._8_8_ = 0;
  _ss = (void *)0x0;
  uStack_1b0 = 0;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x20,&ss,0x88e6);
  pvVar7 = operator_new(0x800);
  lVar19 = 0;
  do {
    puVar9 = (undefined8 *)((long)pvVar7 + lVar19 * 4);
    *puVar9 = 0x700000007;
    puVar9[1] = 0x700000007;
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0x200);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[2]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x800,pvVar7,0x88e6);
  glu::CallLogWrapper::glBindBufferRange(this_00,0x90d2,2,this->m_storage_buffer[2],0,0x400);
  glu::CallLogWrapper::glBindBufferRange(this_00,0x90d2,3,this->m_storage_buffer[2],0x400,0x400);
  operator_delete(pvVar7,0x800);
  __a = (allocator_type *)&ss;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::vector
            (&data_1,2,__a);
  local_1a8._32_8_ = 0;
  local_1a8._40_8_ = 0;
  local_1a8._16_8_ = 0;
  local_1a8._24_8_ = 0;
  local_1a8._0_8_ = (_func_int **)0x0;
  local_1a8._8_8_ = 0;
  _ss = (void *)0x0;
  uStack_1b0 = 0;
  lVar19 = 0;
  lVar12 = 0;
  do {
    lVar14 = 0;
    do {
      uVar22 = 0x3f800000;
      if (lVar19 != lVar14) {
        uVar22 = 0;
      }
      *(undefined4 *)(__a + lVar14) = uVar22;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
    lVar12 = lVar12 + 1;
    __a = __a + 4;
    lVar19 = lVar19 + 0x10;
  } while (lVar12 != 4);
  psVar8 = &ss;
  lVar19 = 0;
  pfVar13 = (float *)data_1.
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  do {
    lVar12 = 0;
    do {
      *(undefined4 *)((long)pfVar13 + lVar12) = *(undefined4 *)(psVar8 + lVar12);
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    lVar19 = lVar19 + 1;
    pfVar13 = pfVar13 + 1;
    psVar8 = psVar8 + 4;
  } while (lVar19 != 4);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,4,this->m_storage_buffer[3]);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,
             (long)data_1.
                   super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)data_1.
                   super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
             data_1.
             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0x88e6);
  if (data_1.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data_1.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)data_1.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data_1.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  _ss = (void *)0x0;
  uStack_1b0 = 0;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_counter_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,1,this->m_counter_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x92c0,0x10,&ss,0x88e6);
  pfVar13 = (float *)&data_1;
  data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&ss,0x10,
             (value_type *)pfVar13,(allocator_type *)&res_1);
  textures = &this->m_texture;
  glu::CallLogWrapper::glGenTextures(this_00,1,textures);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8814,4,4,0,0x1908,0x1406,_ss);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  if (_ss != (void *)0x0) {
    operator_delete(_ss,local_1a8._0_8_ - (long)_ss);
  }
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,this->m_texture,0,'\0',0,0x88ba,0x8814);
  glu::CallLogWrapper::glDispatchCompute(this_00,2,2,2);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x2020);
  glu::CallLogWrapper::glDispatchCompute(this_00,3,2,2);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
  glu::CallLogWrapper::glDispatchCompute(this_00,4,3,7);
  glu::CallLogWrapper::glMemoryBarrier(this_00,800);
  pvVar7 = operator_new(0x100);
  memset(pvVar7,0,0x100);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture);
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->m_fbo);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_fbo);
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,*textures,0);
  puVar9 = (undefined8 *)operator_new(0x40);
  puVar9[6] = 0;
  puVar9[7] = 0;
  puVar9[4] = 0;
  puVar9[5] = 0;
  puVar9[2] = 0;
  puVar9[3] = 0;
  *puVar9 = 0;
  puVar9[1] = 0;
  glu::CallLogWrapper::glReadPixels(this_00,0,0,4,4,0x1908,0x1401,puVar9);
  auVar4 = _DAT_01a2bf40;
  lVar19 = 0;
  do {
    auVar21._0_8_ = (double)*(byte *)((long)puVar9 + lVar19);
    auVar21._8_8_ = (double)*(byte *)((long)puVar9 + lVar19 + 4);
    auVar21 = divpd(auVar21,auVar4);
    auVar23._0_8_ = (double)*(byte *)((long)puVar9 + lVar19 + 1);
    auVar23._8_8_ = (double)*(byte *)((long)puVar9 + lVar19 + 5);
    auVar23 = divpd(auVar23,auVar4);
    auVar24._0_8_ = (double)*(byte *)((long)puVar9 + lVar19 + 2);
    auVar24._8_8_ = (double)*(byte *)((long)puVar9 + lVar19 + 6);
    auVar24 = divpd(auVar24,auVar4);
    auVar25._0_8_ = (double)*(byte *)((long)puVar9 + lVar19 + 3);
    auVar25._8_8_ = (double)*(byte *)((long)puVar9 + lVar19 + 7);
    auVar25 = divpd(auVar25,auVar4);
    pfVar20 = (float *)((long)pvVar7 + lVar19 * 4 + 0x10);
    *pfVar20 = (float)auVar21._8_8_;
    pfVar20[1] = (float)auVar23._8_8_;
    pfVar20[2] = (float)auVar24._8_8_;
    pfVar20[3] = (float)auVar25._8_8_;
    pfVar20 = (float *)((long)pvVar7 + lVar19 * 4);
    *pfVar20 = (float)auVar21._0_8_;
    pfVar20[1] = (float)auVar23._0_8_;
    pfVar20[2] = (float)auVar24._0_8_;
    pfVar20[3] = (float)auVar25._0_8_;
    lVar19 = lVar19 + 8;
  } while (lVar19 != 0x40);
  lVar19 = 0xc;
  do {
    fVar26 = *(float *)((long)pvVar7 + lVar19 + -0xc) + -0.25;
    fVar27 = -fVar26;
    if (-fVar26 <= fVar26) {
      fVar27 = fVar26;
    }
    if ((this->super_ComputeShaderBase).g_color_eps.m_data[0] < fVar27) {
LAB_00914813:
      anon_unknown_0::Output("Invalid data at texture.\n");
      operator_delete(puVar9,0x40);
      operator_delete(pvVar7,0x100);
      return -1;
    }
    fVar26 = *(float *)((long)pvVar7 + lVar19 + -8) + -0.5;
    fVar27 = -fVar26;
    if (-fVar26 <= fVar26) {
      fVar27 = fVar26;
    }
    if ((this->super_ComputeShaderBase).g_color_eps.m_data[1] < fVar27) goto LAB_00914813;
    fVar26 = *(float *)((long)pvVar7 + lVar19 + -4) + -0.75;
    fVar27 = -fVar26;
    if (-fVar26 <= fVar26) {
      fVar27 = fVar26;
    }
    if ((this->super_ComputeShaderBase).g_color_eps.m_data[2] < fVar27) goto LAB_00914813;
    fVar26 = *(float *)((long)pvVar7 + lVar19) + -1.0;
    fVar27 = -fVar26;
    if (-fVar26 <= fVar26) {
      fVar27 = fVar26;
    }
    if ((this->super_ComputeShaderBase).g_color_eps.m_data[3] < fVar27) goto LAB_00914813;
    lVar19 = lVar19 + 0x10;
  } while (lVar19 != 0x10c);
  operator_delete(puVar9,0x40);
  operator_delete(pvVar7,0x100);
  pvVar7 = operator_new(0x814);
  memset(pvVar7,0,0x814);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[0]);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x814,pvVar7);
  lVar19 = 5;
  do {
    uVar2 = *(uint *)((long)pvVar7 + lVar19 * 4);
    if (uVar2 != 4) {
      anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)uVar2,2);
      uVar17 = 0x814;
      goto LAB_009148a2;
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0x205);
  operator_delete(pvVar7,0x814);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[1]);
  uVar17 = 0;
  psVar8 = &ss;
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x20,psVar8);
  do {
    if (uVar17 != *(uint *)(&ss + uVar17 * 4)) {
      anon_unknown_0::Output
                ("Data is: %d should be: %d.\n",(ulong)*(uint *)(&ss + uVar17 * 4),
                 uVar17 & 0xffffffff);
      return -1;
    }
    uVar17 = uVar17 + 1;
  } while (uVar17 != 4);
  pvVar7 = operator_new(0x800);
  memset(pvVar7,0,0x800);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[2]);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x800,pvVar7);
  lVar19 = 0;
  bVar6 = true;
  do {
    uVar2 = *(uint *)((long)pvVar7 + lVar19 * 4);
    if (uVar2 != 5) {
      uVar16 = 5;
LAB_0091488f:
      anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)uVar2,uVar16);
      uVar17 = 0x800;
LAB_009148a2:
      operator_delete(pvVar7,uVar17);
      return -1;
    }
    uVar2 = *(uint *)((long)pvVar7 + lVar19 * 4 + 0x400);
    if (uVar2 != 7) {
      uVar16 = 7;
      goto LAB_0091488f;
    }
    lVar19 = 1;
    uVar3 = !bVar6;
    bVar6 = false;
    if ((bool)uVar3) {
      operator_delete(pvVar7,0x800);
      lVar19 = 0;
      pfVar20 = (float *)&res_1;
      do {
        *(undefined8 *)(local_1a8 + lVar19 + 0x20) = 0;
        *(undefined8 *)(local_1a8 + lVar19 + 0x28) = 0;
        *(undefined8 *)(local_1a8 + lVar19 + 0x10) = 0;
        *(undefined8 *)(local_1a8 + lVar19 + 0x18) = 0;
        *(undefined8 *)(local_1a8 + lVar19) = 0;
        *(undefined8 *)(local_1a8 + lVar19 + 8) = 0;
        *(undefined8 *)(&ss + lVar19) = 0;
        *(undefined8 *)((long)&uStack_1b0 + lVar19) = 0;
        lVar12 = 0;
        lVar14 = 0;
        psVar15 = psVar8;
        do {
          lVar18 = 0;
          do {
            uVar22 = 0x3f800000;
            if (lVar12 != lVar18) {
              uVar22 = 0;
            }
            *(undefined4 *)(psVar15 + lVar18) = uVar22;
            lVar18 = lVar18 + 0x10;
          } while (lVar18 != 0x40);
          lVar14 = lVar14 + 1;
          psVar15 = psVar15 + 4;
          lVar12 = lVar12 + 0x10;
        } while (lVar14 != 4);
        lVar19 = lVar19 + 0x40;
        psVar8 = psVar8 + 0x40;
      } while (lVar19 != 0x80);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[3]);
      psVar8 = &ss;
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x80,psVar8);
      data_1.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      data_1.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      data_1.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar19 = 0;
      lVar12 = 0;
      do {
        lVar14 = 0;
        do {
          uVar22 = 0x3f800000;
          if (lVar19 != lVar14) {
            uVar22 = 0;
          }
          *(undefined4 *)((long)pfVar13 + lVar14) = uVar22;
          lVar14 = lVar14 + 0x10;
        } while (lVar14 != 0x40);
        lVar12 = lVar12 + 1;
        pfVar13 = pfVar13 + 1;
        lVar19 = lVar19 + 0x10;
      } while (lVar12 != 4);
      pvVar10 = &data_1;
      uVar17 = 0;
      bVar6 = false;
      do {
        lVar19 = 0;
        do {
          pfVar13 = (float *)((long)&(pvVar10->
                                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + lVar19);
          if ((*(float *)(psVar8 + lVar19) != *pfVar13) ||
             (NAN(*(float *)(psVar8 + lVar19)) || NAN(*pfVar13))) {
            if (!bVar6) goto LAB_009149c6;
            goto LAB_009148b5;
          }
          lVar19 = lVar19 + 0x10;
        } while (lVar19 != 0x40);
        bVar6 = 2 < uVar17;
        uVar17 = uVar17 + 1;
        pvVar10 = (vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
                  ((long)&(pvVar10->
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 4);
        psVar8 = psVar8 + 4;
      } while (uVar17 != 4);
LAB_009148b5:
      res_1.m_data.m_data[3].m_data[2] = 0.0;
      res_1.m_data.m_data[3].m_data[3] = 0.0;
      res_1.m_data.m_data[2].m_data[0] = 0.0;
      res_1.m_data.m_data[2].m_data[1] = 0.0;
      res_1.m_data.m_data[2].m_data[2] = 0.0;
      res_1.m_data.m_data[2].m_data[3] = 0.0;
      res_1.m_data.m_data[1].m_data[0] = 0.0;
      res_1.m_data.m_data[1].m_data[1] = 0.0;
      res_1.m_data.m_data[1].m_data[2] = 0.0;
      res_1.m_data.m_data[1].m_data[3] = 0.0;
      res_1.m_data.m_data[0].m_data[0] = 0.0;
      res_1.m_data.m_data[0].m_data[1] = 0.0;
      res_1.m_data.m_data[0].m_data[2] = 0.0;
      res_1.m_data.m_data[0].m_data[3] = 0.0;
      lVar19 = 0;
      lVar12 = 0;
      do {
        lVar14 = 0;
        do {
          uVar22 = 0x3f800000;
          if (lVar19 != lVar14) {
            uVar22 = 0;
          }
          *(undefined4 *)((long)pfVar20 + lVar14) = uVar22;
          lVar14 = lVar14 + 0x10;
        } while (lVar14 != 0x40);
        lVar12 = lVar12 + 1;
        pfVar20 = pfVar20 + 1;
        lVar19 = lVar19 + 0x10;
      } while (lVar12 != 4);
      res_1.m_data.m_data[3].m_data[0] = 10.0;
      res_1.m_data.m_data[3].m_data[1] = 20.0;
      res_1.m_data.m_data[3].m_data[2] = 30.0;
      pvVar10 = &data_1;
      tcu::transpose<float,4,4>(&res_1);
      puVar11 = local_1a8 + 0x30;
      uVar17 = 0;
      bVar6 = false;
      do {
        lVar19 = 0;
        do {
          pfVar13 = (float *)((long)&(pvVar10->
                                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + lVar19);
          if ((*(float *)(puVar11 + lVar19) != *pfVar13) ||
             (NAN(*(float *)(puVar11 + lVar19)) || NAN(*pfVar13))) {
            if (!bVar6) {
LAB_009149c6:
              anon_unknown_0::Output("Data is incorrect.\n");
              return -1;
            }
            goto LAB_00914972;
          }
          lVar19 = lVar19 + 0x10;
        } while (lVar19 != 0x40);
        bVar6 = 2 < uVar17;
        uVar17 = uVar17 + 1;
        pvVar10 = (vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
                  ((long)&(pvVar10->
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 4);
        puVar11 = puVar11 + 4;
        if (uVar17 == 4) {
LAB_00914972:
          _ss = (void *)0x0;
          uStack_1b0 = 0;
          glu::CallLogWrapper::glGetBufferSubData(this_00,0x92c0,0,0x10,&ss);
          uVar2 = uStack_1b0._4_4_;
          if (uStack_1b0._4_4_ != 4) {
            anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)uStack_1b0._4_4_,4);
          }
          return -(ulong)(uVar2 != 4);
        }
      } while( true );
    }
  } while( true );
}

Assistant:

virtual long Run()
	{
		using namespace tcu;

		for (int i = 0; i < 3; ++i)
		{
			m_program[i] = CreateComputeProgram(GenGLSL(i));
			glLinkProgram(m_program[i]);
			if (!CheckProgram(m_program[i]))
				return ERROR;
		}

		glGenBuffers(4, m_storage_buffer);
		/* storage buffer 0 */
		{
			std::vector<int> data(5 + 8 * 8 * 8);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(int)), &data[0], GL_STATIC_COPY);
		}
		/* storage buffer 1 */
		{
			const GLuint data[8] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_COPY);
		}
		/* storage buffer 2 & 3 */
		{
			std::vector<GLint> data(512, 7);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(GLint)), &data[0], GL_STATIC_COPY);

			glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2], 0,
							  (GLsizeiptr)(sizeof(GLint) * data.size() / 2));
			glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[2],
							  (GLintptr)(sizeof(GLint) * data.size() / 2),
							  (GLsizeiptr)(sizeof(GLint) * data.size() / 2));
		}
		/* storage buffer 4 */
		{
			std::vector<mat4> data(2);
			data[0] = mat4(1);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(mat4)), &data[0], GL_STATIC_COPY);
		}
		/* counter buffer */
		{
			GLuint data[4] = { 0 };
			glGenBuffers(1, &m_counter_buffer);
			glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 1, m_counter_buffer);
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(data), data, GL_STATIC_COPY);
		}
		/* texture */
		{
			std::vector<vec4> data(4 * 4, vec4(0.0f));
			glGenTextures(1, &m_texture);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 4, 4, 0, GL_RGBA, GL_FLOAT, &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glUseProgram(m_program[0]);
		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glDispatchCompute(2, 2, 2);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT | GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDispatchCompute(3, 2, 2);

		glUseProgram(m_program[1]);
		glDispatchCompute(4, 3, 7);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT | GL_TEXTURE_UPDATE_BARRIER_BIT |
						GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		/* validate texture */
		{
			std::vector<vec4> data(4 * 4);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glGenFramebuffers(1, &m_fbo);
			glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0);
			std::vector<GLubyte> colorData(4 * 4 * 4);
			glReadPixels(0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &colorData[0]);
			for (int i = 0; i < 4 * 4 * 4; i += 4)
			{
				data[i / 4] =
					vec4(static_cast<GLfloat>(colorData[i] / 255.), static_cast<GLfloat>(colorData[i + 1] / 255.),
						 static_cast<GLfloat>(colorData[i + 2] / 255.), static_cast<GLfloat>(colorData[i + 3] / 255.));
			}
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!ColorEqual(data[i], vec4(0.25f, 0.5f, 0.75f, 1.0f), g_color_eps))
				{
					Output("Invalid data at texture.\n");
					return ERROR;
				}
			}
		}
		/* validate storage buffer 0 */
		{
			std::vector<int> data(5 + 8 * 8 * 8);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(data.size() * sizeof(int)), &data[0]);
			for (std::size_t i = 5; i < data.size(); ++i)
			{
				if (data[i] != 4)
				{
					Output("Data is: %d should be: %d.\n", data[i], 2);
					return ERROR;
				}
			}
		}
		/* validate storage buffer 1 */
		{
			GLuint data[8];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (GLuint i = 0; i < 4; ++i)
			{
				if (data[i] != i)
				{
					Output("Data is: %d should be: %d.\n", data[i], i);
					return ERROR;
				}
			}
		}
		/* validate storage buffer 2 & 3 */
		{
			std::vector<GLint> data(512);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(sizeof(GLint) * data.size()), &data[0]);
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != 5)
				{
					Output("Data is: %d should be: %d.\n", data[i], 5);
					return ERROR;
				}
				if (data[i + 256] != 7)
				{
					Output("Data is: %d should be: %d.\n", data[i + 256], 7);
					return ERROR;
				}
			}
		}
		/* validate storage buffer 4 */
		{
			mat4 data[2];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data[0](0, 0));
			if (data[0] != translationMatrix(vec3(10.0f, 20.0f, 30.0f)))
			{
				Output("Data is incorrect.\n");
				return ERROR;
			}
			if (data[1] != transpose(translationMatrix(vec3(10.0f, 20.0f, 30.0f))))
			{
				Output("Data is incorrect.\n");
				return ERROR;
			}
		}
		/* validate counter buffer */
		{
			GLuint data[4] = { 0 };
			glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(data), data);
			if (data[3] != 4)
			{
				Output("Data is: %d should be: %d.\n", data[3], 4);
				return ERROR;
			}
		}

		return NO_ERROR;
	}